

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O3

void __thiscall
onmt::Tokenizer::Tokenizer
          (Tokenizer *this,string *sp_model_path,int sp_nbest_size,float sp_alpha,Mode mode,
          int flags,string *joiner)

{
  undefined1 local_41;
  float local_40;
  int local_3c;
  SentencePiece *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<const_onmt::SubwordEncoder> local_28;
  
  (this->super_ITokenizer)._vptr_ITokenizer = (_func_int **)&PTR__Tokenizer_0037c058;
  local_40 = sp_alpha;
  local_3c = sp_nbest_size;
  Options::Options(&this->_options,mode,flags,joiner);
  (this->_subword_encoder).
  super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_subword_encoder).
  super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Options::validate(&this->_options);
  local_38 = (SentencePiece *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<onmt::SentencePiece_const,std::allocator<onmt::SentencePiece>,std::__cxx11::string_const&,int&,float&>
            (&_Stack_30,&local_38,(allocator<onmt::SentencePiece> *)&local_41,sp_model_path,
             &local_3c,&local_40);
  local_28.super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_38->super_SubwordEncoder;
  local_28.super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_30._M_pi;
  local_38 = (SentencePiece *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  set_subword_encoder(this,&local_28);
  if (local_28.super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return;
}

Assistant:

Tokenizer::Tokenizer(const std::string& sp_model_path,
                       int sp_nbest_size,
                       float sp_alpha,
                       Mode mode,
                       int flags,
                       const std::string& joiner)
    : _options(mode, flags, joiner)
  {
    _options.validate();
    set_subword_encoder(std::make_shared<const SentencePiece>(sp_model_path, sp_nbest_size, sp_alpha));
  }